

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::UniversalTersePrinter<const_char32_t_*>::Print(char32_t *str,ostream *os)

{
  char32_t *pcVar1;
  char32_t *pcVar2;
  long *local_38 [2];
  long local_28 [2];
  
  if (str != (char32_t *)0x0) {
    pcVar2 = str + -1;
    do {
      pcVar1 = pcVar2 + 1;
      pcVar2 = pcVar2 + 1;
    } while (*pcVar1 != L'\0');
    local_38[0] = local_28;
    std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)local_38,str);
    testing::internal::PrintU32StringTo((u32string *)local_38,os);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] * 4 + 4);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"NULL",4);
  return;
}

Assistant:

static void Print(const char32_t* str, ::std::ostream* os) {
    if (str == nullptr) {
      *os << "NULL";
    } else {
      UniversalPrint(::std::u32string(str), os);
    }
  }